

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::setV
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *value,bool need_appearances)

{
  string *psVar1;
  bool bVar2;
  QPDF *qpdf;
  allocator<char> local_99;
  string name;
  string local_78;
  QPDFObjectHandle local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  getFieldType_abi_cxx11_(&name,this);
  bVar2 = std::operator==(&name,"/Btn");
  std::__cxx11::string::~string((string *)&name);
  if (!bVar2) {
    bVar2 = QPDFObjectHandle::isString(value);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&name,"/V",&local_99);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_78,value);
      QPDFObjectHandle::newUnicodeString(&local_58,&local_78);
      setFieldAttribute(this,&name,&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"/V",(allocator<char> *)&local_78);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
      setFieldAttribute(this,&name,(QPDFObjectHandle *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    std::__cxx11::string::~string((string *)&name);
    if (!need_appearances) {
      return;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_QPDFObjectHelper).super_BaseHandle);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,
               "QPDFFormFieldObjectHelper::setV called with need_appearances = true on an object that is not associated with an owning QPDF"
               ,&local_99);
    qpdf = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_78,&name);
    std::__cxx11::string::~string((string *)&name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&name,qpdf)
    ;
    QPDFAcroFormDocumentHelper::setNeedAppearances((QPDFAcroFormDocumentHelper *)&name,true);
    QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&name);
    return;
  }
  bVar2 = isCheckbox(this);
  if (bVar2) {
    bVar2 = QPDFObjectHandle::isName(value);
    if (bVar2) {
      QPDFObjectHandle::getName_abi_cxx11_(&name,value);
      bVar2 = std::operator!=(&name,"/Off");
      setCheckBoxValue(this,bVar2);
      std::__cxx11::string::~string((string *)&name);
      return;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_QPDFObjectHelper).super_BaseHandle);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,
               "ignoring attempt to set a checkbox field to a value whose type is not name",
               &local_99);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&name);
  }
  else {
    bVar2 = isRadioButton(this);
    if (bVar2) {
      bVar2 = QPDFObjectHandle::isName(value);
      if (bVar2) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
        setRadioButtonValue(this,(QPDFObjectHandle *)&local_38);
        psVar1 = (string *)&local_38;
        goto LAB_00159240;
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_QPDFObjectHelper).super_BaseHandle);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,
                 "ignoring attempt to set a radio button field to an object that is not a name",
                 &local_99);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&name);
    }
    else {
      bVar2 = isPushbutton(this);
      if (!bVar2) {
        return;
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_QPDFObjectHelper).super_BaseHandle);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"ignoring attempt set the value of a pushbutton field",&local_99);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_78,&name);
    }
  }
  std::__cxx11::string::~string((string *)&name);
  psVar1 = &local_78;
LAB_00159240:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setV(QPDFObjectHandle value, bool need_appearances)
{
    if (getFieldType() == "/Btn") {
        if (isCheckbox()) {
            bool okay = false;
            if (value.isName()) {
                std::string name = value.getName();
                okay = true;
                // Accept any value other than /Off to mean checked. Files have been seen that use
                // /1 or other values.
                setCheckBoxValue((name != "/Off"));
            }
            if (!okay) {
                oh().warnIfPossible(
                    "ignoring attempt to set a checkbox field to a value whose type is not name");
            }
        } else if (isRadioButton()) {
            if (value.isName()) {
                setRadioButtonValue(value);
            } else {
                oh().warnIfPossible(
                    "ignoring attempt to set a radio button field to an object that is not a name");
            }
        } else if (isPushbutton()) {
            oh().warnIfPossible("ignoring attempt set the value of a pushbutton field");
        }
        return;
    }
    if (value.isString()) {
        setFieldAttribute("/V", QPDFObjectHandle::newUnicodeString(value.getUTF8Value()));
    } else {
        setFieldAttribute("/V", value);
    }
    if (need_appearances) {
        QPDF& qpdf = oh().getQPDF(
            "QPDFFormFieldObjectHelper::setV called with need_appearances = "
            "true on an object that is not associated with an owning QPDF");
        QPDFAcroFormDocumentHelper(qpdf).setNeedAppearances(true);
    }
}